

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::
SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
::
emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
          (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
           *this,pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                 *args)

{
  iterator ppVar1;
  undefined8 *in_RSI;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
  *in_RDI;
  pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
  *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
  *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
    ::end(in_RDI);
    local_8 = emplaceRealloc<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppVar1 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
             ::end(in_RDI);
    (ppVar1->first).definition = (Symbol *)*in_RSI;
    (ppVar1->first).configRoot = (ConfigBlockSymbol *)in_RSI[1];
    (ppVar1->first).configRule = (ConfigRule *)in_RSI[2];
    ppVar1->second = (HierarchicalInstanceSyntax *)in_RSI[3];
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
              ::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }